

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

string * __thiscall
nlohmann::detail::parse_error::position_string_abi_cxx11_
          (string *__return_storage_ptr__,parse_error *this,position_t *pos)

{
  size_type *psVar1;
  size_type *psVar2;
  bool bVar3;
  undefined8 uVar4;
  char cVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  ulong uVar10;
  char cVar11;
  ulong uVar12;
  size_type *local_b0;
  string __str;
  long local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  size_type *local_50;
  string __str_1;
  
  uVar12 = *(long *)&(this->super_exception).m + 1;
  cVar11 = '\x01';
  if (9 < uVar12) {
    uVar10 = uVar12;
    cVar5 = '\x04';
    do {
      cVar11 = cVar5;
      if (uVar10 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_00129103;
      }
      if (uVar10 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_00129103;
      }
      if (uVar10 < 10000) goto LAB_00129103;
      bVar3 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar5 = cVar11 + '\x04';
    } while (bVar3);
    cVar11 = cVar11 + '\x01';
  }
LAB_00129103:
  local_b0 = &__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_b0,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_b0,(uint)__str._M_dataplus._M_p,uVar12);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x14fca6);
  __str.field_2._8_8_ = &local_80;
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_80 = *plVar8;
    lStack_78 = plVar6[3];
  }
  else {
    local_80 = *plVar8;
    __str.field_2._8_8_ = (long *)*plVar6;
  }
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_60 = *puVar9;
    lStack_58 = plVar6[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar9;
    local_70 = (ulong *)*plVar6;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar12 = *(ulong *)&(this->super_exception).id;
  cVar11 = '\x01';
  if (9 < uVar12) {
    uVar10 = uVar12;
    cVar5 = '\x04';
    do {
      cVar11 = cVar5;
      if (uVar10 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_00129244;
      }
      if (uVar10 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_00129244;
      }
      if (uVar10 < 10000) goto LAB_00129244;
      bVar3 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar5 = cVar11 + '\x04';
    } while (bVar3);
    cVar11 = cVar11 + '\x01';
  }
LAB_00129244:
  psVar1 = &__str_1._M_string_length;
  local_50 = psVar1;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_50,(uint)__str_1._M_dataplus._M_p,uVar12);
  uVar12 = CONCAT44(__str_1._M_dataplus._M_p._4_4_,(uint)__str_1._M_dataplus._M_p) + local_68;
  uVar10 = 0xf;
  if (local_70 != &local_60) {
    uVar10 = local_60;
  }
  if (uVar10 < uVar12) {
    uVar10 = 0xf;
    if (local_50 != psVar1) {
      uVar10 = __str_1._M_string_length;
    }
    if (uVar12 <= uVar10) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_70);
      goto LAB_001292bd;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50);
LAB_001292bd:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar7 + 2;
  if ((size_type *)*puVar7 == psVar2) {
    uVar4 = puVar7[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar7[1];
  *puVar7 = psVar2;
  puVar7[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_50 != psVar1) {
    operator_delete(local_50,__str_1._M_string_length + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((long *)__str.field_2._8_8_ != &local_80) {
    operator_delete((void *)__str.field_2._8_8_,local_80 + 1);
  }
  if (local_b0 != &__str._M_string_length) {
    operator_delete(local_b0,__str._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string position_string(const position_t& pos)
    {
        return " at line " + std::to_string(pos.lines_read + 1) +
               ", column " + std::to_string(pos.chars_read_current_line);
    }